

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiNullHandleTests.cpp
# Opt level: O3

TestStatus * vkt::api::anon_unknown_1::reportStatus(TestStatus *__return_storage_ptr__,bool success)

{
  TestStatus *extraout_RAX;
  TestStatus *extraout_RAX_00;
  TestStatus *extraout_RAX_01;
  TestStatus *pTVar1;
  undefined7 in_register_00000031;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  local_30 = local_20;
  if ((int)CONCAT71(in_register_00000031,success) == 0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"Implementation allocated/freed the memory","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_30,local_28 + (long)local_30);
    pTVar1 = extraout_RAX_00;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"OK: no observable change","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_30,local_28 + (long)local_30);
    pTVar1 = extraout_RAX;
  }
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
    pTVar1 = extraout_RAX_01;
  }
  return pTVar1;
}

Assistant:

tcu::TestStatus reportStatus (const bool success)
{
	if (success)
		return tcu::TestStatus::pass("OK: no observable change");
	else
		return tcu::TestStatus::fail("Implementation allocated/freed the memory");
}